

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

uint32_t nsync::nsync_spin_test_and_set_
                   (nsync_atomic_uint32_ *w,uint32_t test,uint32_t set,uint32_t clear)

{
  uint attempts;
  uint uVar1;
  bool bVar2;
  
  uVar1 = (w->super___atomic_base<unsigned_int>)._M_i;
  attempts = 0;
  do {
    if ((uVar1 & test) == 0) {
      LOCK();
      bVar2 = uVar1 == (w->super___atomic_base<unsigned_int>)._M_i;
      if (bVar2) {
        (w->super___atomic_base<unsigned_int>)._M_i = (uVar1 | set) & ~clear;
      }
      UNLOCK();
      if (bVar2) {
        return uVar1;
      }
    }
    attempts = nsync_spin_delay_(attempts);
    uVar1 = (w->super___atomic_base<unsigned_int>)._M_i;
  } while( true );
}

Assistant:

uint32_t nsync_spin_test_and_set_ (nsync_atomic_uint32_ *w, uint32_t test,
				   uint32_t set, uint32_t clear) {
	unsigned attempts = 0; /* CV_SPINLOCK retry count */
	uint32_t old = ATM_LOAD (w);
	while ((old & test) != 0 || !ATM_CAS_ACQ (w, old, (old | set) & ~clear)) {
		attempts = nsync_spin_delay_ (attempts);
		old = ATM_LOAD (w);
	}
	return (old);
}